

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

void xml_skip_whitespace(xml_parser *parser)

{
  ushort *puVar1;
  ushort **ppuVar2;
  ulong uVar3;
  
  ppuVar2 = __ctype_b_loc();
  puVar1 = *ppuVar2;
  uVar3 = parser->position;
  if ((*(byte *)((long)puVar1 + (ulong)parser->buffer[uVar3] * 2 + 1) & 0x20) != 0) {
    do {
      uVar3 = uVar3 + 1;
      if (parser->length <= uVar3) {
        return;
      }
      parser->position = uVar3;
    } while ((*(byte *)((long)puVar1 + (ulong)parser->buffer[uVar3] * 2 + 1) & 0x20) != 0);
  }
  return;
}

Assistant:

static void xml_skip_whitespace(struct xml_parser* parser) {
	xml_parser_info(parser, "whitespace");

	while (isspace(parser->buffer[parser->position])) {
		if (parser->position + 1 >= parser->length) {
			return;
		} else {
			parser->position++;
		}
	}
}